

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
* __thiscall
capnp::compiler::Compiler::Node::resolve
          (Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
           *__return_storage_ptr__,Node *this,StringPtr name)

{
  undefined4 uVar1;
  Node *this_00;
  uint64_t uVar2;
  Impl *pIVar3;
  _Base_ptr p_Var4;
  _Rb_tree_color _Var5;
  undefined4 uVar6;
  int iVar7;
  Node *b;
  CapTableReader *pCVar8;
  iterator iVar9;
  _Base_ptr p_Var10;
  undefined4 uVar11;
  undefined8 uVar12;
  uint extraout_EDX;
  uint uVar13;
  WirePointer *pWVar14;
  size_t sVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  SegmentReader *pSVar18;
  ulong uVar19;
  Reader RVar20;
  Reader params;
  undefined1 local_108 [36];
  undefined8 local_e4;
  undefined1 local_d8 [56];
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  local_a0;
  
  sVar15 = name.content.size_;
  resolveMember(&local_a0,this,name);
  uVar6 = local_108._8_4_;
  uVar1 = local_108._4_4_;
  uVar11 = (uint)sVar15;
  uVar13 = extraout_EDX;
  uVar16 = local_a0.ptr.field_1.value.tag;
  if (local_a0.ptr.isSet == true) {
    local_108._4_4_ = (undefined4)local_a0.ptr.field_1._8_8_;
    local_108._8_4_ = (undefined4)((ulong)local_a0.ptr.field_1._8_8_ >> 0x20);
    if (local_a0.ptr.field_1.value.tag == 2) {
      local_108._12_4_ = local_a0.ptr.field_1._16_4_;
      local_108._16_4_ = local_a0.ptr.field_1._20_4_;
      uVar1 = local_108._4_4_;
      uVar6 = local_108._8_4_;
    }
    else if (local_a0.ptr.field_1.value.tag == 1) {
      local_e4 = local_a0.ptr.field_1._40_8_;
      local_108._20_4_ = (undefined4)local_a0.ptr.field_1._24_8_;
      local_108._24_4_ = (undefined4)((ulong)local_a0.ptr.field_1._24_8_ >> 0x20);
      local_108._28_8_ = local_a0.ptr.field_1._32_8_;
      local_108._12_4_ = local_a0.ptr.field_1._16_4_;
      local_108._16_4_ = local_a0.ptr.field_1._20_4_;
      uVar13 = (uint)(byte)local_a0.ptr.field_1._48_1_;
      uVar1 = local_108._4_4_;
      uVar6 = local_108._8_4_;
      if (local_a0.ptr.field_1._48_1_ == 1) {
        local_d8._39_8_ = local_a0.ptr.field_1._88_8_;
        local_d8._47_8_ = local_a0.ptr.field_1._96_8_;
        local_d8[0x17] = (undefined1)local_a0.ptr.field_1._72_8_;
        local_d8._24_4_ = (undefined4)((ulong)local_a0.ptr.field_1._72_8_ >> 8);
        local_d8._28_3_ = (undefined3)((ulong)local_a0.ptr.field_1._72_8_ >> 0x28);
        local_d8[0x1f] = (undefined1)local_a0.ptr.field_1._80_8_;
        local_d8._32_4_ = (undefined4)((ulong)local_a0.ptr.field_1._80_8_ >> 8);
        local_d8._36_2_ = (undefined2)((ulong)local_a0.ptr.field_1._80_8_ >> 0x28);
        local_d8[0x26] = (undefined1)((ulong)local_a0.ptr.field_1._80_8_ >> 0x38);
        local_d8[7] = (undefined1)local_a0.ptr.field_1._56_8_;
        local_d8._8_7_ = (undefined7)((ulong)local_a0.ptr.field_1._56_8_ >> 8);
        local_d8[0xf] = (undefined1)local_a0.ptr.field_1._64_8_;
        local_d8._16_7_ = (undefined7)((ulong)local_a0.ptr.field_1._64_8_ >> 8);
        local_a0.ptr.field_1._48_1_ = 0;
      }
    }
    local_108._8_4_ = uVar6;
    local_108._4_4_ = uVar1;
    if (local_a0.ptr.field_1.value.tag == 1) {
      uVar16 = 0;
    }
    uVar11 = local_a0.ptr.field_1.value.tag;
    if (uVar16 == 2) {
      uVar16 = 0;
    }
  }
  local_a0.ptr.field_1.value.tag = uVar16;
  if (local_a0.ptr.isSet != false) {
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.tag = uVar11;
    if (uVar11 == 2) {
      *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
           CONCAT44(local_108._8_4_,local_108._4_4_);
      *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
           CONCAT44(local_108._16_4_,local_108._12_4_);
    }
    else if (uVar11 == 1) {
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = local_e4;
      *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) =
           CONCAT44(local_108._24_4_,local_108._20_4_);
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = local_108._28_8_;
      *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) =
           CONCAT44(local_108._8_4_,local_108._4_4_);
      *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
           CONCAT44(local_108._16_4_,local_108._12_4_);
      *(char *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = (char)uVar13;
      if ((uVar13 & 1) != 0) {
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = local_d8._39_8_;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = local_d8._47_8_;
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) =
             CONCAT35(local_d8._28_3_,CONCAT41(local_d8._24_4_,local_d8[0x17]));
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) =
             CONCAT17(local_d8[0x26],
                      CONCAT25(local_d8._36_2_,CONCAT41(local_d8._32_4_,local_d8[0x1f])));
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) =
             CONCAT71(local_d8._8_7_,local_d8[7]);
        *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) =
             CONCAT71(local_d8._16_7_,local_d8[0xf]);
      }
    }
    if (local_a0.ptr.isSet != false) {
      return __return_storage_ptr__;
    }
  }
  if ((this->declaration)._reader.pointerCount < 8) {
    local_d8._24_4_ = 0x7fffffff;
    pCVar8 = (CapTableReader *)0x0;
    pWVar14 = (WirePointer *)0x0;
    pSVar18 = (SegmentReader *)0x0;
  }
  else {
    pSVar18 = (this->declaration)._reader.segment;
    pCVar8 = (this->declaration)._reader.capTable;
    pWVar14 = (this->declaration)._reader.pointers + 7;
    local_d8._24_4_ = (this->declaration)._reader.nestingLimit;
  }
  local_d8._0_7_ = SUB87(pSVar18,0);
  local_d8[7] = (undefined1)((ulong)pSVar18 >> 0x38);
  local_d8._8_7_ = SUB87(pCVar8,0);
  local_d8[0xf] = (undefined1)((ulong)pCVar8 >> 0x38);
  local_d8._16_7_ = SUB87(pWVar14,0);
  local_d8[0x17] = (undefined1)((ulong)pWVar14 >> 0x38);
  capnp::_::PointerReader::getList
            ((ListReader *)&local_a0,(PointerReader *)local_d8,INLINE_COMPOSITE,(word *)0x0);
  if ((ulong)(uint)local_a0.ptr.field_1._16_4_ != 0) {
    uVar19 = 0;
    do {
      capnp::_::ListReader::getStructElement
                ((StructReader *)local_d8,(ListReader *)&local_a0,(ElementCount)uVar19);
      if (local_d8._36_2_ == 0) {
        local_108._24_4_ = 0x7fffffff;
        uVar12 = 0;
        local_108._16_4_ = 0;
        local_108._20_4_ = 0;
        uVar17 = 0;
      }
      else {
        uVar17 = CONCAT17(local_d8[7],local_d8._0_7_);
        uVar12 = CONCAT17(local_d8[0xf],local_d8._8_7_);
        local_108._24_4_ = local_d8._40_4_;
        local_108._16_4_ = local_d8._24_4_;
        local_108._20_4_ = local_d8._28_4_;
      }
      local_108._0_4_ = (undefined4)uVar17;
      local_108._4_4_ = (undefined4)((ulong)uVar17 >> 0x20);
      local_108._8_4_ = (undefined4)uVar12;
      local_108._12_4_ = (undefined4)((ulong)uVar12 >> 0x20);
      RVar20 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)local_108,(void *)0x0,0);
      sVar15 = RVar20.super_StringPtr.content.size_;
      if ((sVar15 == name.content.size_) &&
         ((sVar15 == 0 ||
          (iVar7 = bcmp(RVar20.super_StringPtr.content.ptr,name.content.ptr,sVar15), iVar7 == 0))))
      {
        uVar2 = this->id;
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.tag = 2;
        *(uint64_t *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = uVar2;
        *(ElementCount *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) =
             (ElementCount)uVar19;
        return __return_storage_ptr__;
      }
      uVar19 = uVar19 + 1;
    } while ((uint)local_a0.ptr.field_1._16_4_ != uVar19);
  }
  this_00 = (this->parent).ptr;
  if (this_00 == (Node *)0x0) {
    pIVar3 = this->module->compiler;
    local_d8._0_7_ = name.content.ptr._0_7_;
    local_d8[7] = name.content.ptr._7_1_;
    local_d8._8_7_ = (undefined7)name.content.size_;
    local_d8[0xf] = name.content.size_._7_1_;
    iVar9 = std::
            _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
            ::find(&(pIVar3->builtinDecls)._M_t,(key_type *)local_d8);
    if ((_Rb_tree_header *)iVar9._M_node ==
        &(pIVar3->builtinDecls)._M_t._M_impl.super__Rb_tree_header) {
      p_Var10 = (_Base_ptr)0x0;
    }
    else {
      p_Var10 = iVar9._M_node[1]._M_right;
    }
    if (p_Var10 == (_Base_ptr)0x0) {
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else {
      p_Var4 = p_Var10[2]._M_parent;
      uVar1 = *(undefined4 *)&p_Var10[3].field_0x4;
      _Var5 = p_Var10[3]._M_color;
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.tag = 1;
      *(_Base_ptr *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = p_Var4;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = uVar1;
      *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) = 0;
      *(short *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = (short)_Var5;
      *(_Base_ptr *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = p_Var10;
      *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = 0;
    }
  }
  else {
    resolve(__return_storage_ptr__,this_00,name);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Resolver::ResolveResult>
Compiler::Node::resolve(kj::StringPtr name) {
  // Check members.
  KJ_IF_SOME(member, resolveMember(name)) {
    return member;
  }

  // Check parameters.
  // TODO(perf): Maintain a map?
  auto params = declaration.getParameters();
  for (uint i: kj::indices(params)) {
    if (params[i].getName() == name) {
      ResolveResult result;
      result.init<ResolvedParameter>(ResolvedParameter {id, i});
      return result;
    }
  }

  // Check parent scope.
  KJ_IF_SOME(p, parent) {
    return p.resolve(name);
  } else KJ_IF_SOME(b, module->getCompiler().lookupBuiltin(name)) {
    ResolveResult result;
    result.init<ResolvedDecl>(ResolvedDecl { b.id, b.genericParamCount, 0, b.kind, &b, kj::none });
    return result;
  } else {
    return kj::none;
  }
}